

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::remove_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  uint uVar1;
  Fl_Text_Predelete_Cb *pp_Var2;
  void **ppvVar3;
  ulong uVar4;
  Fl_Text_Predelete_Cb *pp_Var5;
  void **ppvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  uVar1 = this->mNPredeleteProcs;
  pp_Var2 = this->mPredeleteProcs;
  ppvVar3 = this->mPredeleteCbArgs;
  uVar9 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar4 == uVar9) {
      (*Fl::error)("Fl_Text_Buffer::remove_predelete_callback(): Can\'t find pre-delete CB to remove"
                   ,bufPreDeleteCB,cbArg,Fl::error);
      return;
    }
    if ((pp_Var2[uVar9] == bufPreDeleteCB) && (ppvVar3[uVar9] == cbArg)) break;
    uVar9 = uVar9 + 1;
  }
  iVar7 = (int)((long)(int)uVar1 + -1);
  this->mNPredeleteProcs = iVar7;
  if (iVar7 == 0) {
    operator_delete__(pp_Var2);
    this->mPredeleteProcs = (Fl_Text_Predelete_Cb *)0x0;
    if (this->mPredeleteCbArgs != (void **)0x0) {
      operator_delete__(this->mPredeleteCbArgs);
    }
    this->mPredeleteCbArgs = (void **)0x0;
  }
  else {
    uVar4 = ((long)(int)uVar1 + -1) * 8;
    pp_Var5 = (Fl_Text_Predelete_Cb *)operator_new__(uVar4);
    ppvVar6 = (void **)operator_new__(uVar4);
    for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      pp_Var5[uVar4] = pp_Var2[uVar4];
      ppvVar6[uVar4] = ppvVar3[uVar4];
    }
    iVar8 = (int)uVar9;
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    for (; (uint)((int)uVar4 + (iVar7 - iVar8)) != uVar9; uVar9 = uVar9 + 1) {
      pp_Var5[uVar9] = pp_Var2[uVar9 + 1];
      ppvVar6[uVar9] = ppvVar3[uVar9 + 1];
    }
    operator_delete__(pp_Var2);
    if (this->mPredeleteCbArgs != (void **)0x0) {
      operator_delete__(this->mPredeleteCbArgs);
    }
    this->mPredeleteProcs = pp_Var5;
    this->mPredeleteCbArgs = ppvVar6;
  }
  return;
}

Assistant:

void Fl_Text_Buffer::remove_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, void *cbArg)
{
  int i, toRemove = -1;
  /* find the matching callback to remove */
  for (i = 0; i < mNPredeleteProcs; i++) {
    if (mPredeleteProcs[i] == bufPreDeleteCB &&
	mPredeleteCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_predelete_callback(): Can't find pre-delete CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if any are left) */
  mNPredeleteProcs--;
  if (mNPredeleteProcs == 0) {
    delete[]mPredeleteProcs;
    mPredeleteProcs = NULL;
    delete[]mPredeleteCbArgs;
    mPredeleteCbArgs = NULL;
    return;
  }
  Fl_Text_Predelete_Cb *newPreDeleteProcs = new Fl_Text_Predelete_Cb[mNPredeleteProcs];
  void **newCBArgs = new void *[mNPredeleteProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i];
    newCBArgs[i] = mPredeleteCbArgs[i];
  }
  for (; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i + 1];
    newCBArgs[i] = mPredeleteCbArgs[i + 1];
  }
  delete[] mPredeleteProcs;
  delete[] mPredeleteCbArgs;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}